

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void server::serverupdate(void)

{
  long lVar1;
  int *piVar2;
  int iVar3;
  clientinfo *pcVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  undefined8 uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  int i;
  ulong uVar13;
  int i_1;
  long lVar14;
  ban bStack_48;
  
  if ((shouldstep == '\x01') && (gamepaused == '\0')) {
    gamemillis = gamemillis + curtime;
    if (gamemode == -1) {
      readdemo();
    }
    else if (((0x19 < gamemode + 3U) || ((0x3ffffe8UL >> ((ulong)(gamemode + 3U) & 0x3f) & 1) == 0))
            || (gamemillis < gamelimit)) {
      processevents();
      if (curtime != 0) {
        updateBanner();
        lVar14 = 8;
        for (uVar13 = 0; lVar11 = sents, iVar6 = curtime, (long)uVar13 < (long)DAT_00191e7c;
            uVar13 = uVar13 + 1) {
          iVar3 = *(int *)(sents + -4 + lVar14);
          if (iVar3 != 0) {
            uVar10 = iVar3 - curtime;
            *(uint *)(sents + -4 + lVar14) = uVar10;
            if (uVar10 == 0 || iVar3 < iVar6) {
              *(undefined4 *)(lVar11 + -4 + lVar14) = 0;
              *(undefined1 *)(lVar11 + lVar14) = 1;
              uVar8 = 0x19;
              uVar12 = uVar13 & 0xffffffff;
LAB_0013ad3b:
              sendf(-1,1,"ri2",uVar8,uVar12);
            }
            else if (10000 < iVar3 && uVar10 < 0x2711) {
              uVar10 = *(uint *)(lVar11 + -8 + lVar14);
              uVar12 = (ulong)uVar10;
              if ((uVar10 == 0x12) || (uVar10 == 0xf)) {
                uVar8 = 0x46;
                goto LAB_0013ad3b;
              }
            }
          }
          lVar14 = lVar14 + 0xc;
        }
      }
      aiman::checkai();
      if (smode != (long *)0x0) {
        (**(code **)(*smode + 0x60))();
      }
    }
  }
  while ((DAT_00191b8c != 0 && (*(int *)(bannedips + 4) <= totalmillis))) {
    vector<server::ban>::remove((vector<server::ban> *)&bStack_48,(char *)&bannedips);
    ban::~ban(&bStack_48);
  }
  iVar6 = DAT_00191cd4;
  for (lVar14 = 0; lVar14 < iVar6; lVar14 = lVar14 + 1) {
    lVar11 = *(long *)(connects + lVar14 * 8);
    if (15000 < totalmillis - *(int *)(lVar11 + 0x10)) {
      disconnect_client(*(int *)(lVar11 + 8),8);
      iVar6 = DAT_00191cd4;
    }
  }
  if (((nextexceeded != 0) && (nextexceeded < gamemillis)) &&
     ((0x19 < gamemode + 3U ||
      (((0x3ffffe8UL >> ((ulong)(gamemode + 3U) & 0x3f) & 1) == 0 || (gamemillis < gamelimit)))))) {
    nextexceeded = 0;
    for (uVar13 = (ulong)DAT_00191854; 0 < (int)uVar13; uVar13 = uVar13 - 1) {
      pcVar4 = *(clientinfo **)(clients + -8 + uVar13 * 8);
      if ((pcVar4->state).super_fpsstate.aitype == 0) {
        bVar5 = clientinfo::checkexceeded(pcVar4);
        if (bVar5) {
          disconnect_client(pcVar4->clientnum,4);
        }
        else {
          clientinfo::scheduleexceeded(pcVar4);
        }
      }
    }
  }
  checkteamkills();
  if ((shouldstep == '\x01') && (gamepaused == '\0')) {
    if ((gamemode + 3U < 0x1a) &&
       ((((0x3ffffe8UL >> ((ulong)(gamemode + 3U) & 0x3f) & 1) != 0 && (smapname != '\0')) &&
        (curtime < gamemillis)))) {
      checkintermission(false);
    }
    if ((0 < interm) && (interm < gamemillis)) {
      if (demorecord != 0) {
        enddemorecord();
      }
      interm = -1;
      checkvotes(true);
    }
  }
  lVar14 = 0;
  do {
    if ((int)DAT_00191854 <= lVar14) {
      shouldstep = 0 < (int)DAT_00191854;
      return;
    }
    pcVar4 = *(clientinfo **)(clients + lVar14 * 8);
    if ((long)multifragmillis <= (long)totalmillis - (pcVar4->state).lastfragmillis) {
      iVar6 = (pcVar4->state).multifrags;
      if (minmultikill <= iVar6) {
        uVar13 = (ulong)DAT_001922fc;
        if ((int)DAT_001922fc < 1) {
          uVar13 = 0;
        }
        lVar9 = uVar13 + 1;
        lVar11 = multikillmessages + -0x104;
        do {
          lVar9 = lVar9 + -1;
          if (lVar9 == 0) {
            pcVar7 = colorname(pcVar4);
            out(3,"\f2%s scored a \f6%s (%d)",pcVar7,defmultikillmsg,
                (ulong)(uint)(pcVar4->state).multifrags);
            goto LAB_0013af81;
          }
          lVar1 = lVar11 + 0x108;
          piVar2 = (int *)(lVar11 + 0x104);
          lVar11 = lVar1;
        } while (*piVar2 != iVar6);
        pcVar7 = colorname(pcVar4);
        out(3,"\f2%s scored a \f6%s",pcVar7,lVar1);
      }
LAB_0013af81:
      (pcVar4->state).multifrags = 0;
    }
    lVar14 = lVar14 + 1;
  } while( true );
}

Assistant:

void serverupdate()
    {
        if(shouldstep && !gamepaused)
        {
            gamemillis += curtime;
            
            if(m_demo) readdemo();
            else if(!m_timed || gamemillis < gamelimit)
            {
                processevents();
                if(curtime)
                {
                    updateBanner();
                    loopv(sents) if(sents[i].spawntime) //spawn entities when timer reached
                    {
                        int oldtime = sents[i].spawntime;
                        sents[i].spawntime -= curtime;
                        if(sents[i].spawntime<=0)
                        {
                            sents[i].spawntime = 0;
                            sents[i].spawned = true;
                            sendf(-1, 1, "ri2", N_ITEMSPAWN, i);
                        }
                        else if(sents[i].spawntime<=10000 && oldtime>10000 && (sents[i].type==I_QUAD || sents[i].type==I_BOOST))
                        {
                            sendf(-1, 1, "ri2", N_ANNOUNCE, sents[i].type);
                        }
                    }
                }
                aiman::checkai();
                if(smode) smode->update();
            }
        }
        
        while(bannedips.length() && bannedips[0].expire-totalmillis <= 0) bannedips.remove(0);
        loopv(connects) if(totalmillis-connects[i]->connectmillis>15000) disconnect_client(connects[i]->clientnum, DISC_TIMEOUT);
        if(nextexceeded && gamemillis > nextexceeded && (!m_timed || gamemillis < gamelimit))
        {
            nextexceeded = 0;
            loopvrev(clients)
            {
                clientinfo &c = *clients[i];
                if(c.state.aitype != AI_NONE) continue;
                if(c.checkexceeded()) disconnect_client(c.clientnum, DISC_MSGERR);
                else c.scheduleexceeded();
            }
        }
        checkteamkills();
        
        if(shouldstep && !gamepaused)
        {
            if(m_timed && smapname[0] && gamemillis-curtime>0) checkintermission();
            if(interm > 0 && gamemillis>interm)
            {
                if(demorecord) enddemorecord();
                interm = -1;
                checkvotes(true);
            }
        }
       	//multi kill
        loopv(clients) {
            clientinfo *ci = clients[i];
            if(totalmillis - ci->state.lastfragmillis >= (int64_t)multifragmillis) {
                if(ci->state.multifrags >= minmultikill) {
                    char *msg = NULL;
                    loopv(multikillmessages) {
                        if(multikillmessages[i].frags == ci->state.multifrags) {
                            msg = multikillmessages[i].msg;
                            break;
                        }
                    }
                    if(msg) out(ECHO_SERV,"\f2%s scored a \f6%s", colorname(ci), msg);
                    else out(ECHO_SERV,"\f2%s scored a \f6%s (%d)", colorname(ci), defmultikillmsg, ci->state.multifrags);
                }
                ci->state.multifrags = 0;
            }
        }
        shouldstep = clients.length() > 0;
    }